

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O3

int main(void)

{
  int iVar1;
  
  UnityBegin(
            "/workspace/llm4binary/github/license_all_cmakelists_25/icsiii[P]embedded-abstract-message/vendor/cJSON/tests/misc_tests.c"
            );
  UnityDefaultTestRun(cjson_array_foreach_should_loop_over_arrays,
                      "cjson_array_foreach_should_loop_over_arrays",0x14b);
  UnityDefaultTestRun(cjson_array_foreach_should_not_dereference_null_pointer,
                      "cjson_array_foreach_should_not_dereference_null_pointer",0x14c);
  UnityDefaultTestRun(cjson_get_object_item_should_get_object_items,
                      "cjson_get_object_item_should_get_object_items",0x14d);
  UnityDefaultTestRun(cjson_get_object_item_case_sensitive_should_get_object_items,
                      "cjson_get_object_item_case_sensitive_should_get_object_items",0x14e);
  UnityDefaultTestRun(typecheck_functions_should_check_type,"typecheck_functions_should_check_type",
                      0x14f);
  UnityDefaultTestRun(cjson_should_not_parse_to_deeply_nested_jsons,
                      "cjson_should_not_parse_to_deeply_nested_jsons",0x150);
  UnityDefaultTestRun(cjson_set_number_value_should_set_numbers,
                      "cjson_set_number_value_should_set_numbers",0x151);
  UnityDefaultTestRun(cjson_detach_item_via_pointer_should_detach_items,
                      "cjson_detach_item_via_pointer_should_detach_items",0x152);
  UnityDefaultTestRun(cjson_replace_item_via_pointer_should_replace_items,
                      "cjson_replace_item_via_pointer_should_replace_items",0x153);
  UnityDefaultTestRun(cjson_replace_item_in_object_should_preserve_name,
                      "cjson_replace_item_in_object_should_preserve_name",0x154);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

int main(void)
{
    UNITY_BEGIN();

    RUN_TEST(cjson_array_foreach_should_loop_over_arrays);
    RUN_TEST(cjson_array_foreach_should_not_dereference_null_pointer);
    RUN_TEST(cjson_get_object_item_should_get_object_items);
    RUN_TEST(cjson_get_object_item_case_sensitive_should_get_object_items);
    RUN_TEST(typecheck_functions_should_check_type);
    RUN_TEST(cjson_should_not_parse_to_deeply_nested_jsons);
    RUN_TEST(cjson_set_number_value_should_set_numbers);
    RUN_TEST(cjson_detach_item_via_pointer_should_detach_items);
    RUN_TEST(cjson_replace_item_via_pointer_should_replace_items);
    RUN_TEST(cjson_replace_item_in_object_should_preserve_name);

    return UNITY_END();
}